

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  long *plVar1;
  Label *v1;
  Label *v2;
  char *pcVar2;
  LogMessage *pLVar3;
  CppType *v1_00;
  CppType *v2_00;
  undefined8 uVar4;
  LogMessage local_98;
  Voidify local_81;
  CppType local_80;
  CppType local_7c;
  Nullable<const_char_*> local_78;
  LogMessage local_60;
  Voidify local_49;
  Label local_48;
  Label local_44;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  MessageFactory *factory_local;
  Descriptor *message_type_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)factory;
  factory_local = (MessageFactory *)message_type;
  message_type_local._4_4_ = number;
  pEStack_18 = this;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)FindOrNull(this,number);
  if (((Extension *)absl_log_internal_check_op_result == (Extension *)0x0) ||
     (((byte)((Extension *)absl_log_internal_check_op_result)->field_0xa >> 1 & 1) != 0)) {
    this_local = (ExtensionSet *)
                 (**(code **)((extension->field_0).int64_t_value + 0x10))(extension,factory_local);
  }
  else {
    local_44 = LABEL_OPTIONAL;
    if ((((Extension *)absl_log_internal_check_op_result)->is_repeated & 1U) != 0) {
      local_44 = LABEL_REPEATED;
    }
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Label>(&local_44);
    local_48 = LABEL_OPTIONAL;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Label>(&local_48);
    local_40 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                         (v1,v2,
                          "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_OPTIONAL"
                         );
    if (local_40 != (Nullable<const_char_*>)0x0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_40);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x7b,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    local_7c = internal::cpp_type(absl_log_internal_check_op_result[8]);
    v1_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                      (&local_7c);
    local_80 = CPPTYPE_MESSAGE;
    v2_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                      (&local_80);
    local_78 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                         (v1_00,v2_00,
                          "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
    if (local_78 != (Nullable<const_char_*>)0x0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_78);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x7b,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
    if (((byte)absl_log_internal_check_op_result[10] >> 2 & 1) == 0) {
      this_local = *(ExtensionSet **)absl_log_internal_check_op_result;
    }
    else {
      plVar1 = *(long **)absl_log_internal_check_op_result;
      uVar4 = (**(code **)((extension->field_0).int64_t_value + 0x10))(extension,factory_local);
      this_local = (ExtensionSet *)(**(code **)(*plVar1 + 0x18))(plVar1,uVar4,this->arena_);
    }
  }
  return (MessageLite *)this_local;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type), arena_);
    } else {
      return *extension->ptr.message_value;
    }
  }
}